

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diagnostics.cc
# Opt level: O0

ostream * flow::diagnostics::operator<<(ostream *os,BufferedReport *report)

{
  bool bVar1;
  string_view local_a8;
  string local_98;
  string_view local_68;
  string local_58;
  Message *local_38;
  Message *message;
  const_iterator __end2;
  const_iterator __begin2;
  BufferedReport *__range2;
  BufferedReport *report_local;
  ostream *os_local;
  
  __end2 = BufferedReport::begin(report);
  message = (Message *)BufferedReport::end(report);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_flow::diagnostics::Message_*,_std::vector<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>_>
                                *)&message);
    if (!bVar1) break;
    local_38 = __gnu_cxx::
               __normal_iterator<const_flow::diagnostics::Message_*,_std::vector<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>_>
               ::operator*(&__end2);
    if (local_38->type == Warning) {
      fmt::v5::basic_string_view<char>::basic_string_view(&local_68,"Warning: {}\n");
      fmt::v5::format<flow::diagnostics::Message>(&local_58,local_68,local_38);
      std::operator<<(os,(string *)&local_58);
      std::__cxx11::string::~string((string *)&local_58);
    }
    else {
      fmt::v5::basic_string_view<char>::basic_string_view(&local_a8,"Error: {}\n");
      fmt::v5::format<flow::diagnostics::Message>(&local_98,local_a8,local_38);
      std::operator<<(os,(string *)&local_98);
      std::__cxx11::string::~string((string *)&local_98);
    }
    __gnu_cxx::
    __normal_iterator<const_flow::diagnostics::Message_*,_std::vector<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>_>
    ::operator++(&__end2);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const BufferedReport& report) {
  for (const Message& message: report) {
    switch (message.type) {
      case Type::Warning:
        os << fmt::format("Warning: {}\n", message);
        break;
      default:
        os << fmt::format("Error: {}\n", message);
        break;
    }
  }
  return os;
}